

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_open(uv_udp_t *handle,uv_os_sock_t sock)

{
  int iVar1;
  int err;
  uv_os_sock_t sock_local;
  uv_udp_t *handle_local;
  
  if ((handle->io_watcher).fd == -1) {
    iVar1 = uv__fd_exists(handle->loop,sock);
    if (iVar1 == 0) {
      handle_local._4_4_ = uv__nonblock_ioctl(sock,1);
      if ((handle_local._4_4_ == 0) &&
         (handle_local._4_4_ = uv__set_reuse(sock), handle_local._4_4_ == 0)) {
        (handle->io_watcher).fd = sock;
        iVar1 = uv__udp_is_connected(handle);
        if (iVar1 != 0) {
          handle->flags = handle->flags | 0x2000000;
        }
        handle_local._4_4_ = 0;
      }
    }
    else {
      handle_local._4_4_ = -0x11;
    }
  }
  else {
    handle_local._4_4_ = -0x10;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_open(uv_udp_t* handle, uv_os_sock_t sock) {
  int err;

  /* Check for already active socket. */
  if (handle->io_watcher.fd != -1)
    return UV_EBUSY;

  if (uv__fd_exists(handle->loop, sock))
    return UV_EEXIST;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  err = uv__set_reuse(sock);
  if (err)
    return err;

  handle->io_watcher.fd = sock;
  if (uv__udp_is_connected(handle))
    handle->flags |= UV_HANDLE_UDP_CONNECTED;

  return 0;
}